

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# productquantizer.cc
# Opt level: O2

real __thiscall
fasttext::ProductQuantizer::mulcode
          (ProductQuantizer *this,Vector *x,uint8_t *codes,int32_t t,real alpha)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  real *prVar5;
  ulong uVar6;
  float *pfVar7;
  ulong uVar8;
  ulong uVar9;
  undefined1 auVar10 [64];
  
  uVar1 = this->nsubq_;
  iVar2 = this->dsub_;
  uVar3 = this->lastdsub_;
  pfVar7 = (x->data_).mem_;
  auVar10 = ZEXT1664(ZEXT816(0) << 0x40);
  uVar9 = (long)iVar2;
  for (uVar8 = 0; uVar8 != (~((int)uVar1 >> 0x1f) & uVar1); uVar8 = uVar8 + 1) {
    prVar5 = get_centroids(this,(int32_t)uVar8,codes[uVar8 + (long)(int)(t * uVar1)]);
    auVar10 = ZEXT464((uint)auVar10._0_4_);
    uVar9 = uVar9 & 0xffffffff;
    if (uVar8 == uVar1 - 1) {
      uVar9 = (ulong)uVar3;
    }
    for (uVar6 = 0; (~((int)(uint)uVar9 >> 0x1f) & (uint)uVar9) != uVar6; uVar6 = uVar6 + 1) {
      auVar4 = vfmadd231ss_fma(auVar10._0_16_,ZEXT416((uint)pfVar7[uVar6]),
                               ZEXT416((uint)prVar5[uVar6]));
      auVar10 = ZEXT1664(auVar4);
    }
    pfVar7 = pfVar7 + iVar2;
  }
  return auVar10._0_4_ * alpha;
}

Assistant:

real ProductQuantizer::mulcode(
    const Vector& x,
    const uint8_t* codes,
    int32_t t,
    real alpha) const {
  real res = 0.0;
  auto d = dsub_;
  const uint8_t* code = codes + nsubq_ * t;
  for (auto m = 0; m < nsubq_; m++) {
    const real* c = get_centroids(m, code[m]);
    if (m == nsubq_ - 1) {
      d = lastdsub_;
    }
    for (auto n = 0; n < d; n++) {
      res += x[m * dsub_ + n] * c[n];
    }
  }
  return res * alpha;
}